

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O0

ssize_t __thiscall
QDecompressHelper::read(QDecompressHelper *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  qsizetype qVar2;
  undefined4 in_register_00000034;
  qsizetype bytesRead;
  qsizetype cachedRead;
  QDecompressHelper *in_stack_ffffffffffffffd0;
  long local_28;
  QDecompressHelper *data;
  QDecompressHelper *in_stack_fffffffffffffff8;
  long lVar3;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  if ((long)__buf < 1) {
    lVar3 = 0;
  }
  else {
    data = this;
    bVar1 = isValid(this);
    if (bVar1) {
      bVar1 = hasData(in_stack_ffffffffffffffd0);
      if (bVar1) {
        local_28 = 0;
        bVar1 = QByteDataBuffer::isEmpty((QByteDataBuffer *)0x2a9b22);
        if (!bVar1) {
          local_28 = QByteDataBuffer::read(&this->decompressedDataBuffer,(int)lVar3,__buf,__nbytes);
          lVar3 = local_28 + lVar3;
        }
        qVar2 = readInternal(in_stack_fffffffffffffff8,(char *)data,lVar3);
        if (qVar2 == -1) {
          lVar3 = -1;
        }
        else {
          this->totalBytesRead = qVar2 + local_28 + this->totalBytesRead;
          lVar3 = qVar2 + local_28;
        }
      }
      else {
        lVar3 = 0;
      }
    }
    else {
      lVar3 = -1;
    }
  }
  return lVar3;
}

Assistant:

qsizetype QDecompressHelper::read(char *data, qsizetype maxSize)
{
    if (maxSize <= 0)
        return 0;

    if (!isValid())
        return -1;

    if (!hasData())
        return 0;

    qsizetype cachedRead = 0;
    if (!decompressedDataBuffer.isEmpty()) {
        cachedRead = decompressedDataBuffer.read(data, maxSize);
        data += cachedRead;
        maxSize -= cachedRead;
    }

    qsizetype bytesRead = readInternal(data, maxSize);
    if (bytesRead == -1)
        return -1;
    totalBytesRead += bytesRead + cachedRead;
    return bytesRead + cachedRead;
}